

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__tga_test(stbi__context *s)

{
  byte bVar1;
  int iVar2;
  stbi_uc *psVar3;
  byte *pbVar4;
  uint uVar5;
  int iVar7;
  void *pvVar8;
  byte bVar9;
  uint uVar6;
  
  psVar3 = s->img_buffer;
  if (psVar3 < s->img_buffer_end) {
LAB_00125ad8:
    s->img_buffer = psVar3 + 1;
  }
  else if (s->read_from_callbacks != 0) {
    psVar3 = s->buffer_start;
    iVar2 = (*(s->io).read)(s->io_user_data,(char *)psVar3,s->buflen);
    s->callback_already_read =
         s->callback_already_read + (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
    if (iVar2 == 0) {
      s->read_from_callbacks = 0;
      s->img_buffer = psVar3;
      s->img_buffer_end = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
    }
    else {
      s->img_buffer = psVar3;
      s->img_buffer_end = psVar3 + iVar2;
    }
    psVar3 = s->img_buffer;
    goto LAB_00125ad8;
  }
  pbVar4 = s->img_buffer;
  if (pbVar4 < s->img_buffer_end) {
LAB_00125b5d:
    s->img_buffer = pbVar4 + 1;
    bVar9 = *pbVar4;
  }
  else {
    if (s->read_from_callbacks != 0) {
      psVar3 = s->buffer_start;
      iVar2 = (*(s->io).read)(s->io_user_data,(char *)psVar3,s->buflen);
      s->callback_already_read =
           s->callback_already_read + (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
      if (iVar2 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar3;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar3;
        s->img_buffer_end = psVar3 + iVar2;
      }
      pbVar4 = s->img_buffer;
      goto LAB_00125b5d;
    }
    bVar9 = 0;
  }
  uVar5 = 0;
  uVar6 = 0;
  if (1 < bVar9) goto LAB_00125b73;
  pbVar4 = s->img_buffer;
  if (pbVar4 < s->img_buffer_end) {
LAB_00125c08:
    s->img_buffer = pbVar4 + 1;
    bVar1 = *pbVar4;
  }
  else {
    if (s->read_from_callbacks != 0) {
      psVar3 = s->buffer_start;
      iVar2 = (*(s->io).read)(s->io_user_data,(char *)psVar3,s->buflen);
      s->callback_already_read =
           s->callback_already_read + (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
      if (iVar2 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar3;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar3;
        s->img_buffer_end = psVar3 + iVar2;
      }
      pbVar4 = s->img_buffer;
      goto LAB_00125c08;
    }
    bVar1 = 0;
  }
  if (bVar9 == 1) {
    if ((bVar1 & 0xf7) != 1) goto LAB_00125b73;
    if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00125c99:
      s->img_buffer = s->img_buffer + 4;
    }
    else {
      iVar2 = (int)s->img_buffer_end - *(int *)&s->img_buffer;
      if (3 < iVar2) goto LAB_00125c99;
      s->img_buffer = s->img_buffer_end;
      (*(s->io).skip)(s->io_user_data,4 - iVar2);
    }
    pbVar4 = s->img_buffer;
    if (pbVar4 < s->img_buffer_end) {
LAB_00125d28:
      s->img_buffer = pbVar4 + 1;
      bVar1 = *pbVar4;
    }
    else {
      if (s->read_from_callbacks != 0) {
        psVar3 = s->buffer_start;
        iVar2 = (*(s->io).read)(s->io_user_data,(char *)psVar3,s->buflen);
        s->callback_already_read =
             s->callback_already_read + (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
        if (iVar2 == 0) {
          s->read_from_callbacks = 0;
          s->img_buffer = psVar3;
          s->img_buffer_end = s->buffer_start + 1;
          s->buffer_start[0] = '\0';
        }
        else {
          s->img_buffer = psVar3;
          s->img_buffer_end = psVar3 + iVar2;
        }
        pbVar4 = s->img_buffer;
        goto LAB_00125d28;
      }
      bVar1 = 0;
    }
    if ((0x20 < bVar1) || (uVar5 = uVar6, (0x101018100U >> ((ulong)bVar1 & 0x3f) & 1) == 0))
    goto LAB_00125b73;
    if ((s->io).read != (_func_int_void_ptr_char_ptr_int *)0x0) {
      iVar2 = (int)s->img_buffer_end - *(int *)&s->img_buffer;
      if (iVar2 < 4) {
        s->img_buffer = s->img_buffer_end;
        pvVar8 = s->io_user_data;
        iVar7 = 4;
        goto LAB_00125d81;
      }
    }
    s->img_buffer = s->img_buffer + 4;
  }
  else {
    uVar5 = uVar6;
    if ((bVar1 & 0xf6) != 2) goto LAB_00125b73;
    if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00125cf3:
      s->img_buffer = s->img_buffer + 9;
    }
    else {
      iVar2 = (int)s->img_buffer_end - *(int *)&s->img_buffer;
      if (8 < iVar2) goto LAB_00125cf3;
      s->img_buffer = s->img_buffer_end;
      pvVar8 = s->io_user_data;
      iVar7 = 9;
LAB_00125d81:
      (*(s->io).skip)(pvVar8,iVar7 - iVar2);
    }
  }
  iVar2 = stbi__get16le(s);
  uVar5 = uVar6;
  if (iVar2 == 0) goto LAB_00125b73;
  iVar2 = stbi__get16le(s);
  if (iVar2 == 0) goto LAB_00125b73;
  pbVar4 = s->img_buffer;
  if (pbVar4 < s->img_buffer_end) {
LAB_00125e2a:
    s->img_buffer = pbVar4 + 1;
    bVar1 = *pbVar4;
  }
  else {
    if (s->read_from_callbacks != 0) {
      psVar3 = s->buffer_start;
      iVar2 = (*(s->io).read)(s->io_user_data,(char *)psVar3,s->buflen);
      s->callback_already_read =
           s->callback_already_read + (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
      if (iVar2 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar3;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar3;
        s->img_buffer_end = psVar3 + iVar2;
      }
      pbVar4 = s->img_buffer;
      goto LAB_00125e2a;
    }
    bVar1 = 0;
  }
  if (bVar9 == 1) {
    uVar5 = (uint)((bVar1 - 8 & 0xf7) == 0);
  }
  else if ((bVar1 < 0x21) && ((0x101018100U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
    uVar5 = 1;
  }
LAB_00125b73:
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  return uVar5;
}

Assistant:

static int stbi__tga_test(stbi__context *s)
{
   int res = 0;
   int sz, tga_color_type;
   stbi__get8(s);      //   discard Offset
   tga_color_type = stbi__get8(s);   //   color type
   if ( tga_color_type > 1 ) goto errorEnd;   //   only RGB or indexed allowed
   sz = stbi__get8(s);   //   image type
   if ( tga_color_type == 1 ) { // colormapped (paletted) image
      if (sz != 1 && sz != 9) goto errorEnd; // colortype 1 demands image type 1 or 9
      stbi__skip(s,4);       // skip index of first colormap entry and number of entries
      sz = stbi__get8(s);    //   check bits per palette color entry
      if ( (sz != 8) && (sz != 15) && (sz != 16) && (sz != 24) && (sz != 32) ) goto errorEnd;
      stbi__skip(s,4);       // skip image x and y origin
   } else { // "normal" image w/o colormap
      if ( (sz != 2) && (sz != 3) && (sz != 10) && (sz != 11) ) goto errorEnd; // only RGB or grey allowed, +/- RLE
      stbi__skip(s,9); // skip colormap specification and image x/y origin
   }
   if ( stbi__get16le(s) < 1 ) goto errorEnd;      //   test width
   if ( stbi__get16le(s) < 1 ) goto errorEnd;      //   test height
   sz = stbi__get8(s);   //   bits per pixel
   if ( (tga_color_type == 1) && (sz != 8) && (sz != 16) ) goto errorEnd; // for colormapped images, bpp is size of an index
   if ( (sz != 8) && (sz != 15) && (sz != 16) && (sz != 24) && (sz != 32) ) goto errorEnd;

   res = 1; // if we got this far, everything's good and we can return 1 instead of 0

errorEnd:
   stbi__rewind(s);
   return res;
}